

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

bool __thiscall
duckdb::QuantileCompare<duckdb::MadAccessor<short,_short,_short>_>::operator()
          (QuantileCompare<duckdb::MadAccessor<short,_short,_short>_> *this,INPUT_TYPE *lhs,
          INPUT_TYPE *rhs)

{
  bool bVar1;
  ushort uVar2;
  OutOfRangeException *pOVar3;
  ushort uVar4;
  ushort uVar5;
  string local_40;
  
  uVar2 = *lhs - *this->accessor_l->median;
  if (uVar2 == 0x8000) {
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Overflow on abs(%d)","");
    OutOfRangeException::OutOfRangeException<short>(pOVar3,&local_40,-0x8000);
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = *rhs - *this->accessor_r->median;
  if (uVar4 != 0x8000) {
    uVar5 = -uVar2;
    if (0 < (short)uVar2) {
      uVar5 = uVar2;
    }
    uVar2 = -uVar4;
    if (0 < (short)uVar4) {
      uVar2 = uVar4;
    }
    bVar1 = uVar2 >= uVar5 && uVar2 != uVar5;
    if (this->desc != false) {
      bVar1 = uVar2 < uVar5;
    }
    return bVar1;
  }
  pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Overflow on abs(%d)","");
  OutOfRangeException::OutOfRangeException<short>(pOVar3,&local_40,-0x8000);
  __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}